

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_position.c
# Opt level: O0

void test_read_position(void)

{
  size_t sVar1;
  int iVar2;
  wchar_t wVar3;
  size_t sVar4;
  ulong local_28;
  size_t i;
  size_t write_pos;
  archive_entry *ae;
  archive *a;
  
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'K',L'\x01',"sizeof(nulls) + 512 + 1024 <= sizeof(buff)",(void *)0x0);
  ae = (archive_entry *)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'N',(uint)(ae != (archive_entry *)0x0),"NULL != (a = archive_write_new())",
                   (void *)0x0);
  iVar2 = archive_write_set_format_pax_restricted((archive *)ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'O',(uint)(iVar2 == 0),"0 == archive_write_set_format_pax_restricted(a)",ae);
  iVar2 = archive_write_set_bytes_per_block((archive *)ae,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'P',(uint)(iVar2 == 0),"0 == archive_write_set_bytes_per_block(a, 512)",ae);
  iVar2 = archive_write_open_memory((archive *)ae,buff,10000,&i);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'Q',(uint)(iVar2 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &write_pos)",ae);
  for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
    write_pos = (size_t)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'U',(uint)((archive_entry *)write_pos != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_pathname((archive_entry *)write_pos,"testfile");
    archive_entry_set_mode((archive_entry *)write_pos,0x8000);
    archive_entry_set_size((archive_entry *)write_pos,data_sizes[local_28]);
    iVar2 = archive_write_header((archive *)ae,(archive_entry *)write_pos);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'Y',(uint)(iVar2 == 0),"0 == archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)write_pos);
    sVar1 = data_sizes[local_28];
    sVar4 = archive_write_data((archive *)ae,nulls,1000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'\\',(uint)(sVar1 == sVar4),
                     "data_sizes[i] == (size_t)archive_write_data(a, nulls, sizeof(nulls))",ae);
  }
  iVar2 = archive_write_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'^',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",ae);
  iVar2 = archive_write_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'b',(uint)(ae != (archive_entry *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  wVar3 = archive_read_support_format_tar((archive *)ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'c',(uint)(wVar3 == L'\0'),"0 == archive_read_support_format_tar(a)",ae);
  iVar2 = read_open_memory((archive *)ae,buff,10000,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'd',(uint)(iVar2 == 0),"0 == read_open_memory(a, buff, sizeof(buff), 512)",ae);
  verify_read_positions((archive *)ae);
  archive_read_free((archive *)ae);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'i',(uint)(ae != (archive_entry *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  wVar3 = archive_read_support_format_tar((archive *)ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'j',(uint)(wVar3 == L'\0'),"0 == archive_read_support_format_tar(a)",ae);
  iVar2 = read_open_memory_minimal((archive *)ae,buff,10000,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'k',(uint)(iVar2 == 0),
                   "0 == read_open_memory_minimal(a, buff, sizeof(buff), 512)",ae);
  verify_read_positions((archive *)ae);
  archive_read_free((archive *)ae);
  return;
}

Assistant:

DEFINE_TEST(test_read_position)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t write_pos;
	size_t i;

	/* Sanity test */
	assert(sizeof(nulls) + 512 + 1024 <= sizeof(buff));

	/* Create an archive. */
	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_pax_restricted(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &write_pos));

	for (i = 0; i < sizeof(data_sizes)/sizeof(data_sizes[0]); ++i) {
		/* Create a simple archive_entry. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_pathname(ae, "testfile");
		archive_entry_set_mode(ae, S_IFREG);
		archive_entry_set_size(ae, data_sizes[i]);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);
		assertA(data_sizes[i]
		    == (size_t)archive_write_data(a, nulls, sizeof(nulls)));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Read the archive back with a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

	/* Read the archive back without a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory_minimal(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

}